

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void HFSubWorker::distributionController(zsock_t *pipe,void *args)

{
  bool bVar1;
  zsock_t *pzVar2;
  char *pcVar3;
  iterator this;
  long *in_RSI;
  zsock_t *in_RDI;
  _zactor_t *worker_1;
  iterator __end1;
  iterator __begin1;
  vector<_zactor_t_*,_std::allocator<_zactor_t_*>_> *__range1;
  zactor_t *worker;
  int i;
  vector<_zactor_t_*,_std::allocator<_zactor_t_*>_> workers;
  zloop_t *loop;
  HFSubWorker *self;
  vector<_zactor_t_*,_std::allocator<_zactor_t_*>_> *in_stack_ffffffffffffff78;
  zactor_t *in_stack_ffffffffffffff80;
  zactor_t *in_stack_ffffffffffffff88;
  vector<_zactor_t_*,_std::allocator<_zactor_t_*>_> *in_stack_ffffffffffffff90;
  __normal_iterator<_zactor_t_**,_std::vector<_zactor_t_*,_std::allocator<_zactor_t_*>_>_> local_68;
  undefined1 *local_60;
  zactor_t *local_48;
  int local_3c;
  undefined1 local_38 [24];
  zloop_t *local_20;
  long *local_18;
  long *local_10;
  zsock_t *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  zsock_signal(in_RDI,'\0');
  local_18 = local_10;
  pzVar2 = zsock_new_checked(8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                             ,0x184);
  local_18[0x17] = (long)pzVar2;
  zsock_bind((zsock_t *)local_18[0x17],"inproc://push_%p",local_10);
  pcVar3 = zsock_endpoint((zsock_t *)local_18[0x17]);
  std::__cxx11::string::operator=((string *)(local_18 + 0x18),pcVar3);
  local_20 = zloop_new();
  zloop_reader(local_20,local_8,HighFreqSub::pipeController,local_18);
  (**(code **)(*local_18 + 0x20))(local_18,local_20);
  std::vector<_zactor_t_*,_std::allocator<_zactor_t_*>_>::vector
            ((vector<_zactor_t_*,_std::allocator<_zactor_t_*>_> *)0x1cd338);
  for (local_3c = 0; local_3c < *(int *)((long)local_18 + 0xb4); local_3c = local_3c + 1) {
    in_stack_ffffffffffffff80 = zactor_new(workerthreadController,local_18);
    local_48 = in_stack_ffffffffffffff80;
    std::vector<_zactor_t_*,_std::allocator<_zactor_t_*>_>::push_back
              (in_stack_ffffffffffffff90,(value_type *)in_stack_ffffffffffffff88);
  }
  zloop_start(local_20);
  zsock_destroy_checked
            ((zsock_t **)(local_18 + 0x17),
             "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
             ,0x195);
  zloop_destroy(&local_20);
  local_60 = local_38;
  local_68._M_current =
       (_zactor_t **)
       std::vector<_zactor_t_*,_std::allocator<_zactor_t_*>_>::begin(in_stack_ffffffffffffff78);
  this = std::vector<_zactor_t_*,_std::allocator<_zactor_t_*>_>::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<_zactor_t_**,_std::vector<_zactor_t_*,_std::allocator<_zactor_t_*>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<_zactor_t_**,_std::vector<_zactor_t_*,_std::allocator<_zactor_t_*>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<_zactor_t_**,_std::vector<_zactor_t_*,_std::allocator<_zactor_t_*>_>_>::
    operator*(&local_68);
    zactor_destroy((zactor_t **)&stack0xffffffffffffff88);
    __gnu_cxx::
    __normal_iterator<_zactor_t_**,_std::vector<_zactor_t_*,_std::allocator<_zactor_t_*>_>_>::
    operator++(&local_68);
  }
  std::vector<_zactor_t_*,_std::allocator<_zactor_t_*>_>::~vector
            ((vector<_zactor_t_*,_std::allocator<_zactor_t_*>_> *)this._M_current);
  return;
}

Assistant:

void HFSubWorker::distributionController(zsock_t *pipe, void *args){
    zsock_signal(pipe, 0);
    HFSubWorker *self = (HFSubWorker*)args;

    //Create push socket

    self->push = zsock_new(ZMQ_PUSH);
    zsock_bind(self->push, "inproc://push_%p", args);
    self->pullendpoint = zsock_endpoint(self->push);

    //Start loop controlling actor and sub sockets
    zloop_t *loop = zloop_new();
    zloop_reader(loop, pipe, pipeController, self);
    self->sub_reader(loop);

    //Start worker threads
    std::vector<zactor_t*> workers;
    for(int i = 0; i < self->nthreads; i++){
        zactor_t *worker = zactor_new(workerthreadController, self);
        workers.push_back(worker);
    }

    zloop_start(loop);
    zsock_destroy(&self->push);
    zloop_destroy(&loop);
    for(auto worker : workers){
        zactor_destroy(&worker);
    }
}